

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.h
# Opt level: O0

ssize_t Fixpp::details::FieldWriter<Fixpp::Field<Fixpp::TagT<262U,_Fixpp::Type::String>_>_>::write
                  (int __fd,void *__buf,size_t __n)

{
  Type *__str;
  ostream *poVar1;
  undefined4 in_register_0000003c;
  string local_38 [8];
  Type value;
  Field<Fixpp::TagT<262U,_Fixpp::Type::String>_> *field_local;
  ostream *os_local;
  
  value.field_2._8_8_ = __buf;
  __str = Field<Fixpp::TagT<262u,Fixpp::Type::String>>::get_abi_cxx11_
                    ((Field<Fixpp::TagT<262u,Fixpp::Type::String>> *)__buf);
  std::__cxx11::string::string(local_38,__str);
  poVar1 = (ostream *)std::ostream::operator<<((void *)CONCAT44(in_register_0000003c,__fd),0x106);
  poVar1 = std::operator<<(poVar1,"=");
  poVar1 = std::operator<<(poVar1,local_38);
  std::operator<<(poVar1,'|');
  std::__cxx11::string::~string(local_38);
  return (ssize_t)(void *)CONCAT44(in_register_0000003c,__fd);
}

Assistant:

static std::ostream& write(std::ostream& os, const Field& field)
        {
            auto value = field.get();
            os << Field::Tag::Id << "=" << value << SOH;
            return os;
        }